

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (DescribeWalletAddressVisitor *this,CNoDestination *dest)

{
  UniValue *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  UniValue *pUVar1;
  UniValue *this_00;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (UniValue *)&stack0xffffffffffffffd8;
  pUVar1 = in_RDI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  UniValue::UniValue(this_00,(VType)((ulong)pUVar1 >> 0x20),(string *)in_RDI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const CNoDestination& dest) const { return UniValue(UniValue::VOBJ); }